

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstract.c
# Opt level: O0

ErrorNumber test_abstract(void)

{
  ErrorNumber EVar1;
  TA_RetCode TVar2;
  char *pcVar3;
  char *xmlArray;
  int i;
  TA_FuncHandle *handle;
  TA_ParamHolder *paramHolder;
  TA_FuncHandle *in_stack_00000028;
  TA_RetCode retCode;
  ErrorNumber retValue;
  TA_ParamHolder *in_stack_ffffffffffffffc8;
  int local_24;
  TA_ParamHolder *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  uint in_stack_fffffffffffffffc;
  
  printf("Testing Abstract interface\n");
  EVar1 = allocLib();
  if (EVar1 == TA_TEST_PASS) {
    TVar2 = TA_GetFuncHandle((char *)((ulong)in_stack_fffffffffffffffc << 0x20),
                             (TA_FuncHandle **)
                             CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
    if (TVar2 == TA_SUCCESS) {
      TVar2 = TA_ParamHolderAlloc(in_stack_00000028,(TA_ParamHolder **)paramHolder);
      if (TVar2 == TA_SUCCESS) {
        EVar1 = testLookback(in_stack_ffffffffffffffc8);
        if (EVar1 == TA_TEST_PASS) {
          TVar2 = TA_ParamHolderFree(in_stack_ffffffffffffffe8);
          if (TVar2 == TA_SUCCESS) {
            EVar1 = freeLib();
            if ((EVar1 == TA_TEST_PASS) && (EVar1 = allocLib(), EVar1 == TA_TEST_PASS)) {
              EVar1 = test_default_calls();
              if (EVar1 == TA_TEST_PASS) {
                EVar1 = freeLib();
                if (EVar1 == TA_TEST_PASS) {
                  pcVar3 = TA_FunctionDescriptionXML();
                  for (local_24 = 0; (local_24 < 1000000 && (pcVar3[local_24] != '\0'));
                      local_24 = local_24 + 1) {
                  }
                  if (local_24 < 500) {
                    printf("TA_FunctionDescriptionXML failed. Size too small.\n");
                    EVar1 = TA_ABS_TST_FAIL_FUNCTION_DESC_SMALL;
                  }
                  else if (local_24 == 1000000) {
                    printf("TA_FunctionDescriptionXML failed. Size too large (missing null?).\n");
                    EVar1 = TA_ABS_TST_FAIL_FUNCTION_DESC_LARGE;
                  }
                  else {
                    EVar1 = TA_TEST_PASS;
                  }
                }
              }
              else {
                printf("TA-Abstract default call failed\n");
              }
            }
          }
          else {
            printf("TA_ParamHolderFree failed [%d]\n",(ulong)TVar2);
            EVar1 = TA_ABS_TST_FAIL_PARAMHOLDERFREE;
          }
        }
        else {
          printf("testLookback() failed [%d]\n",(ulong)EVar1);
          TA_ParamHolderFree(in_stack_ffffffffffffffe8);
        }
      }
      else {
        printf("Can\'t allocate the param holder [%d]\n",(ulong)TVar2);
        EVar1 = TA_ABS_TST_FAIL_PARAMHOLDERALLOC;
      }
    }
    else {
      printf("Can\'t get the function handle [%d]\n",(ulong)TVar2);
      EVar1 = TA_ABS_TST_FAIL_GETFUNCHANDLE;
    }
  }
  return EVar1;
}

Assistant:

ErrorNumber test_abstract( void )
{
   ErrorNumber retValue;
   TA_RetCode retCode;
   TA_ParamHolder *paramHolder;
   const TA_FuncHandle *handle;
   int i;
   const char *xmlArray;

   printf( "Testing Abstract interface\n" );

   retValue = allocLib();
   if( retValue != TA_TEST_PASS )
      return retValue;

   /* Verify TA_GetLookback. */
   retCode = TA_GetFuncHandle( "STOCH", &handle );
   if( retCode != TA_SUCCESS )
   {
      printf( "Can't get the function handle [%d]\n", retCode );
      return TA_ABS_TST_FAIL_GETFUNCHANDLE;
   }

   retCode = TA_ParamHolderAlloc( handle, &paramHolder );
   if( retCode != TA_SUCCESS )
   {
      printf( "Can't allocate the param holder [%d]\n", retCode );
      return TA_ABS_TST_FAIL_PARAMHOLDERALLOC;
   }

   retValue = testLookback(paramHolder);
   if( retValue != TA_SUCCESS )
   {
      printf( "testLookback() failed [%d]\n", retValue );
      TA_ParamHolderFree( paramHolder );
      return retValue;
   }

   retCode = TA_ParamHolderFree( paramHolder );
   if( retCode != TA_SUCCESS )
   {
      printf( "TA_ParamHolderFree failed [%d]\n", retCode );
      return TA_ABS_TST_FAIL_PARAMHOLDERFREE;
   }

   retValue = freeLib();
   if( retValue != TA_TEST_PASS )
      return retValue;

   /* Call all the TA functions through the abstract interface. */
   retValue = allocLib();
   if( retValue != TA_TEST_PASS )
      return retValue;

   retValue = test_default_calls();
   if( retValue != TA_TEST_PASS )
   {
      printf( "TA-Abstract default call failed\n" );
      return retValue;
   }

   retValue = freeLib();
   if( retValue != TA_TEST_PASS )
      return retValue;

   /* Verify that the TA_FunctionDescription is null terminated
    * and as at least 500 characters (less is guaranteed bad...)
    */
   xmlArray = TA_FunctionDescriptionXML();
   for( i=0; i < 1000000; i++ )
   {
      if( xmlArray[i] == 0x0 )
         break;
   }

   if( i < 500)
   {
      printf( "TA_FunctionDescriptionXML failed. Size too small.\n" );
      return TA_ABS_TST_FAIL_FUNCTION_DESC_SMALL;
   }

   if( i == 1000000 )
   {
      printf( "TA_FunctionDescriptionXML failed. Size too large (missing null?).\n" );
      return TA_ABS_TST_FAIL_FUNCTION_DESC_LARGE;
   }

   return TA_TEST_PASS; /* Succcess. */
}